

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O3

int udp_options_test(sockaddr *addr)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  anon_union_28_2_e90107a3_for_address *paVar8;
  uv_loop_t *loop;
  ulong uVar9;
  int iVar10;
  uv_loop_t *puVar11;
  uv_loop_t *puVar12;
  uv_loop_t *puVar13;
  uv_loop_t *puVar14;
  long lVar15;
  bool bVar16;
  uv_udp_t h;
  undefined1 auStack_2f8 [216];
  undefined1 auStack_220 [240];
  sockaddr_in6 sStack_130;
  uv_loop_t *puStack_110;
  uv_udp_t local_100;
  
  puStack_110 = (uv_loop_t *)0x18776b;
  puVar6 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x18777b;
  iVar2 = uv_udp_init(puVar6,&local_100);
  if (iVar2 != 0) goto LAB_00187927;
  puStack_110 = (uv_loop_t *)0x187790;
  uv_unref((uv_handle_t *)&local_100);
  puStack_110 = (uv_loop_t *)0x18779d;
  iVar2 = uv_udp_bind(&local_100,addr,0);
  if (iVar2 != 0) goto LAB_0018792c;
  iVar10 = 1;
  puStack_110 = (uv_loop_t *)0x1877bc;
  iVar2 = uv_udp_set_broadcast(&local_100,1);
  puStack_110 = (uv_loop_t *)0x1877cc;
  iVar3 = uv_udp_set_broadcast(&local_100,1);
  puStack_110 = (uv_loop_t *)0x1877dc;
  iVar4 = uv_udp_set_broadcast(&local_100,0);
  puStack_110 = (uv_loop_t *)0x1877ec;
  iVar5 = uv_udp_set_broadcast(&local_100,0);
  if (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))) goto LAB_00187931;
  do {
    puStack_110 = (uv_loop_t *)0x187804;
    iVar2 = uv_udp_set_ttl(&local_100,iVar10);
    if (iVar2 != 0) {
      puStack_110 = (uv_loop_t *)0x18791d;
      udp_options_test_cold_4();
      goto LAB_0018791d;
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x100);
  lVar15 = 0;
  do {
    puStack_110 = (uv_loop_t *)0x187831;
    iVar2 = uv_udp_set_ttl(&local_100,*(int *)((long)udp_options_test::invalid_ttls + lVar15));
    if (iVar2 != -0x16) goto LAB_0018791d;
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0xc);
  puStack_110 = (uv_loop_t *)0x187856;
  iVar2 = uv_udp_set_multicast_loop(&local_100,1);
  puStack_110 = (uv_loop_t *)0x187865;
  iVar3 = uv_udp_set_multicast_loop(&local_100,1);
  iVar10 = 0;
  puStack_110 = (uv_loop_t *)0x187877;
  iVar4 = uv_udp_set_multicast_loop(&local_100,0);
  puStack_110 = (uv_loop_t *)0x187887;
  iVar5 = uv_udp_set_multicast_loop(&local_100,0);
  if (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))) goto LAB_00187936;
  do {
    puStack_110 = (uv_loop_t *)0x18789f;
    iVar2 = uv_udp_set_multicast_ttl(&local_100,iVar10);
    if (iVar2 != 0) goto LAB_00187922;
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x100);
  puStack_110 = (uv_loop_t *)0x1878bc;
  iVar2 = uv_udp_set_multicast_ttl(&local_100,0x100);
  if (iVar2 != -0x16) goto LAB_0018793b;
  puStack_110 = (uv_loop_t *)0x1878cb;
  iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
  if (iVar2 != 0) goto LAB_00187940;
  puStack_110 = (uv_loop_t *)0x1878d4;
  puVar6 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1878e8;
  uv_walk(puVar6,close_walk_cb,(void *)0x0);
  puStack_110 = (uv_loop_t *)0x1878f2;
  uv_run(puVar6,UV_RUN_DEFAULT);
  puStack_110 = (uv_loop_t *)0x1878f7;
  puVar7 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1878ff;
  iVar2 = uv_loop_close(puVar7);
  if (iVar2 == 0) {
    puStack_110 = (uv_loop_t *)0x187908;
    uv_library_shutdown();
    return extraout_EAX;
  }
  goto LAB_00187945;
LAB_0018791d:
  puStack_110 = (uv_loop_t *)0x187922;
  udp_options_test_cold_5();
LAB_00187922:
  puStack_110 = (uv_loop_t *)0x187927;
  udp_options_test_cold_7();
LAB_00187927:
  puStack_110 = (uv_loop_t *)0x18792c;
  udp_options_test_cold_1();
LAB_0018792c:
  puStack_110 = (uv_loop_t *)0x187931;
  udp_options_test_cold_2();
LAB_00187931:
  puStack_110 = (uv_loop_t *)0x187936;
  udp_options_test_cold_3();
LAB_00187936:
  puStack_110 = (uv_loop_t *)0x18793b;
  udp_options_test_cold_6();
LAB_0018793b:
  puStack_110 = (uv_loop_t *)0x187940;
  udp_options_test_cold_8();
LAB_00187940:
  puStack_110 = (uv_loop_t *)0x187945;
  udp_options_test_cold_9();
LAB_00187945:
  puStack_110 = (uv_loop_t *)run_test_udp_options6;
  udp_options_test_cold_10();
  auStack_220._216_8_ = (void *)0x18795e;
  puStack_110 = puVar6;
  iVar2 = uv_interface_addresses
                    ((uv_interface_address_t **)(auStack_220 + 0xf0),(int *)(auStack_220 + 0xec));
  if (iVar2 != 0) {
LAB_001879cf:
    auStack_220._216_8_ = (void *)0x1879d4;
    run_test_udp_options6_cold_1();
    return 1;
  }
  if ((long)(int)auStack_220._236_4_ < 1) {
    auStack_220._216_8_ = (void *)0x1879cf;
    uv_free_interface_addresses((uv_interface_address_t *)sStack_130._0_8_,auStack_220._236_4_);
    goto LAB_001879cf;
  }
  paVar8 = (anon_union_28_2_e90107a3_for_address *)(sStack_130._0_8_ + 0x14);
  uVar9 = 1;
  do {
    uVar1 = (paVar8->address4).sin_family;
    if (uVar1 == 10) break;
    paVar8 = (anon_union_28_2_e90107a3_for_address *)((long)paVar8 + 0x50);
    bVar16 = uVar9 < (ulong)(long)(int)auStack_220._236_4_;
    uVar9 = uVar9 + 1;
  } while (bVar16);
  auStack_220._216_8_ = (void *)0x187998;
  uv_free_interface_addresses((uv_interface_address_t *)sStack_130._0_8_,auStack_220._236_4_);
  if (uVar1 != 10) goto LAB_001879cf;
  auStack_220._216_8_ = (void *)0x1879b4;
  iVar2 = uv_ip6_addr("::",0x23a3,(sockaddr_in6 *)(auStack_220 + 0xf0));
  if (iVar2 == 0) {
    auStack_220._216_8_ = (void *)0x1879c2;
    udp_options_test((sockaddr *)(auStack_220 + 0xf0));
    return 0;
  }
  auStack_220._216_8_ = run_test_udp_no_autobind;
  run_test_udp_options6_cold_2();
  puVar11 = (uv_loop_t *)auStack_2f8;
  puVar14 = (uv_loop_t *)auStack_2f8;
  puVar12 = (uv_loop_t *)auStack_2f8;
  puVar7 = (uv_loop_t *)auStack_2f8;
  puVar13 = (uv_loop_t *)auStack_2f8;
  auStack_220._216_8_ = (void *)(ulong)uVar1;
  loop = uv_default_loop();
  puVar6 = loop;
  iVar2 = uv_udp_init(loop,(uv_udp_t *)auStack_220);
  if (iVar2 == 0) {
    puVar6 = (uv_loop_t *)auStack_220;
    iVar2 = uv_udp_set_multicast_ttl((uv_udp_t *)puVar6,0x20);
    if (iVar2 != -9) goto LAB_00187b88;
    puVar6 = (uv_loop_t *)auStack_220;
    iVar2 = uv_udp_set_broadcast((uv_udp_t *)puVar6,1);
    if (iVar2 != -9) goto LAB_00187b8d;
    puVar6 = (uv_loop_t *)auStack_220;
    iVar2 = uv_udp_set_ttl((uv_udp_t *)puVar6,1);
    if (iVar2 != -9) goto LAB_00187b92;
    puVar6 = (uv_loop_t *)auStack_220;
    iVar2 = uv_udp_set_multicast_loop((uv_udp_t *)puVar6,1);
    if (iVar2 != -9) goto LAB_00187b97;
    puVar6 = (uv_loop_t *)auStack_220;
    iVar2 = uv_udp_set_multicast_interface((uv_udp_t *)puVar6,"0.0.0.0");
    if (iVar2 != -9) goto LAB_00187b9c;
    uv_close((uv_handle_t *)auStack_220,(uv_close_cb)0x0);
    puVar6 = loop;
    iVar2 = uv_udp_init_ex(loop,(uv_udp_t *)auStack_2f8,0x102);
    if (iVar2 != 0) goto LAB_00187ba1;
    iVar2 = uv_udp_set_multicast_ttl((uv_udp_t *)auStack_2f8,0x20);
    puVar6 = puVar11;
    if (iVar2 != 0) goto LAB_00187ba6;
    iVar2 = uv_udp_set_broadcast((uv_udp_t *)auStack_2f8,1);
    if (iVar2 != 0) goto LAB_00187bab;
    iVar2 = uv_udp_set_ttl((uv_udp_t *)auStack_2f8,1);
    puVar14 = puVar12;
    if (iVar2 != 0) goto LAB_00187bb0;
    iVar2 = uv_udp_set_multicast_loop((uv_udp_t *)auStack_2f8,1);
    if (iVar2 != 0) goto LAB_00187bb5;
    iVar2 = uv_udp_set_multicast_interface((uv_udp_t *)auStack_2f8,"0.0.0.0");
    puVar7 = puVar13;
    if (iVar2 != 0) goto LAB_00187bba;
    uv_close((uv_handle_t *)auStack_2f8,(uv_close_cb)0x0);
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 == 0) {
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uv_run(puVar6,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar2 = uv_loop_close(loop);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00187bc4;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_00187b88:
    run_test_udp_no_autobind_cold_2();
LAB_00187b8d:
    run_test_udp_no_autobind_cold_3();
LAB_00187b92:
    run_test_udp_no_autobind_cold_4();
LAB_00187b97:
    run_test_udp_no_autobind_cold_5();
LAB_00187b9c:
    run_test_udp_no_autobind_cold_6();
LAB_00187ba1:
    run_test_udp_no_autobind_cold_7();
LAB_00187ba6:
    puVar14 = puVar6;
    run_test_udp_no_autobind_cold_8();
LAB_00187bab:
    run_test_udp_no_autobind_cold_9();
LAB_00187bb0:
    puVar7 = puVar14;
    run_test_udp_no_autobind_cold_10();
LAB_00187bb5:
    run_test_udp_no_autobind_cold_11();
LAB_00187bba:
    loop = puVar7;
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_00187bc4:
  run_test_udp_no_autobind_cold_14();
  iVar2 = uv_is_closing((uv_handle_t *)loop);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

static int udp_options_test(const struct sockaddr* addr) {
  static int invalid_ttls[] = { -1, 0, 256 };
  uv_loop_t* loop;
  uv_udp_t h;
  int i, r;

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h); /* don't keep the loop alive */

  r = uv_udp_bind(&h, addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 0);
  r |= uv_udp_set_broadcast(&h, 0);
  ASSERT(r == 0);

  /* values 1-255 should work */
  for (i = 1; i <= 255; i++) {
    r = uv_udp_set_ttl(&h, i);
#if defined(__MVS__)
    if (addr->sa_family == AF_INET6)
      ASSERT(r == 0);
    else
      ASSERT(r == UV_ENOTSUP);
#else
    ASSERT(r == 0);
#endif
  }

  for (i = 0; i < (int) ARRAY_SIZE(invalid_ttls); i++) {
    r = uv_udp_set_ttl(&h, invalid_ttls[i]);
    ASSERT(r == UV_EINVAL);
  }

  r = uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 0);
  r |= uv_udp_set_multicast_loop(&h, 0);
  ASSERT(r == 0);

  /* values 0-255 should work */
  for (i = 0; i <= 255; i++) {
    r = uv_udp_set_multicast_ttl(&h, i);
    ASSERT(r == 0);
  }

  /* anything >255 should fail */
  r = uv_udp_set_multicast_ttl(&h, 256);
  ASSERT(r == UV_EINVAL);
  /* don't test ttl=-1, it's a valid value on some platforms */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}